

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall
summarycalc::processsummarysets
          (summarycalc *this,int coverage_or_output_id,int sidx,OASIS_FLOAT gul)

{
  bool bVar1;
  reference piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  iterator it;
  OASIS_FLOAT gul_local;
  int sidx_local;
  int coverage_or_output_id_local;
  summarycalc *this_local;
  
  it._M_current._4_4_ = gul;
  local_28._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->foutIndex_);
  while( true ) {
    local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(&this->foutIndex_);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_28);
    processsummaryset(this,*piVar2,coverage_or_output_id,sidx,it._M_current._4_4_);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_28);
  }
  return;
}

Assistant:

inline void summarycalc::processsummarysets(const int coverage_or_output_id,
					    const int sidx,
					    const OASIS_FLOAT gul)
{
	for (auto it = foutIndex_.begin(); it != foutIndex_.end(); ++it) {
		processsummaryset(*it, coverage_or_output_id, sidx, gul);
	}
}